

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Float __thiscall pbrt::FloatDotsTexture::Evaluate(FloatDotsTexture *this,TextureEvalContext ctx)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  Float FVar2;
  undefined1 auVar3 [64];
  Tuple2<pbrt::Vector2,_float> *local_90;
  Tuple3<pbrt::Point3,_float> *local_88;
  Tuple2<pbrt::Point2,_float> *pTStack_80;
  Vector2f **local_78;
  Tuple2<pbrt::Point2,_float> local_70;
  Tuple2<pbrt::Vector2,_float> local_68;
  undefined8 local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [3];
  int iStack_1c;
  undefined1 extraout_var [56];
  
  local_70 = (Tuple2<pbrt::Point2,_float>)&local_60;
  pTStack_80 = &local_70;
  local_90 = &local_68;
  local_60 = 0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_88 = local_58;
  local_78 = (Vector2f **)&local_90;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  func.dstdx = (Vector2f **)pTStack_80;
  func.ctx = (TextureEvalContext *)local_88;
  func.dstdy = local_78;
  auVar3._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar3._8_56_ = extraout_var;
  local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  bVar1 = DotsBase::Inside((Point2f *)&local_70);
  if (bVar1) {
    local_88 = (Tuple3<pbrt::Point3,_float> *)
               (this->insideDot).
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits;
  }
  else {
    local_88 = (Tuple3<pbrt::Point3,_float> *)
               (this->outsideDot).
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits;
  }
  aTStack_40[2].z = ctx.dvdy;
  iStack_1c = ctx.faceIndex;
  aTStack_40[2].x = ctx.dudy;
  aTStack_40[2].y = ctx.dvdx;
  aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_40[1].z = ctx.dudx;
  aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  FVar2 = detail::DispatchSplit<12>::operator()
                    ((DispatchSplit<12> *)&local_90,local_58,&local_88,(ulong)local_88 >> 0x30);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx) : outsideDot.Evaluate(ctx);
    }